

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::SoftmaxWithLoss::SoftmaxWithLoss(SoftmaxWithLoss *this,size_t n)

{
  size_t n_local;
  SoftmaxWithLoss *this_local;
  
  ALossLayer::ALossLayer(&this->super_ALossLayer);
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__00195ac8;
  this->nSize = n;
  std::valarray<float>::valarray(&this->softmaxOutput,n);
  std::valarray<float>::valarray(&this->lossGrad,n);
  return;
}

Assistant:

SoftmaxWithLoss(size_t n) : nSize(n), softmaxOutput(n), lossGrad(n) {}